

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O3

int newton_min_trust(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,double *dx,
                    double fsval,double delta,int method,int MAXITER,int *niter,double eps,
                    double gtol,double stol,double *xf)

{
  int iVar1;
  int iVar2;
  double *f;
  double *array;
  double *xi_00;
  double *x;
  double *H;
  double *L;
  double *ioval;
  ulong uVar3;
  char *__format;
  size_t sVar4;
  ulong uVar5;
  double eps2;
  double dVar6;
  double dVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  double dVar11;
  double *pdVar12;
  int local_88;
  
  sVar4 = (long)N * 8;
  f = (double *)malloc(sVar4);
  array = (double *)malloc(sVar4);
  xi_00 = (double *)malloc(sVar4);
  x = (double *)malloc(sVar4);
  sVar4 = sVar4 * (long)N;
  H = (double *)malloc(sVar4);
  L = (double *)malloc(sVar4);
  ioval = (double *)malloc(0x40);
  *niter = 0;
  pow(eps,0.3333333333333333);
  if (eps < 0.0) {
    eps2 = sqrt(eps);
  }
  else {
    eps2 = SQRT(eps);
  }
  *ioval = (double)(~-(ulong)(0.0 < delta) & 0xbff0000000000000 |
                   (ulong)delta & -(ulong)(0.0 < delta));
  uVar5 = (ulong)(uint)N;
  if (0 < N) {
    uVar3 = 0;
    do {
      xi[uVar3] = dx[uVar3] * xi[uVar3];
      dx[uVar3] = 1.0 / dx[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  dVar6 = (*funcpt->funcpt)(xi,N,funcpt->params);
  dVar7 = ABS(dVar6);
  local_88 = 0;
  if (1.79769313486232e+308 <= dVar7) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    local_88 = 0xf;
  }
  if (NAN(dVar6)) {
    printf("Program Exiting as the function returns NaN");
    local_88 = 0xf;
  }
  iVar1 = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,f);
  if (iVar1 == 0xf) {
    local_88 = 0xf;
  }
  dVar11 = 0.0;
  dVar6 = 0.0;
  if (0 < N) {
    uVar3 = 0;
    do {
      dVar10 = dx[uVar3];
      dVar6 = dVar6 + dVar10 * dVar10;
      dVar11 = dVar11 + dVar10 * xi[uVar3] * dVar10 * xi[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  pdVar12 = H;
  if (N < 1) {
    dVar7 = array_max_abs(array,N);
    if (dVar7 <= gtol * 0.001) {
LAB_0013355b:
      local_88 = 1;
    }
    iVar2 = hessian_opt(funcpt,funcgrad,xi,N,f,dx,eps,eps2,H);
    iVar1 = 0xf;
    if (iVar2 == 0xf) goto LAB_001335e4;
  }
  else {
    if (dVar7 <= ABS(fsval)) {
      dVar7 = ABS(fsval);
    }
    uVar3 = 0;
    do {
      dVar10 = ABS(xi[uVar3]);
      if (ABS(xi[uVar3]) <= 1.0 / ABS(dx[uVar3])) {
        dVar10 = 1.0 / ABS(dx[uVar3]);
      }
      array[uVar3] = (ABS(f[uVar3]) * dVar10) / dVar7;
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
    dVar7 = array_max_abs(array,N);
    if (dVar7 <= gtol * 0.001) {
      if (N < 1) goto LAB_0013355b;
      uVar3 = 0;
      do {
        xf[uVar3] = xi[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
      local_88 = 1;
    }
    iVar1 = hessian_opt(funcpt,funcgrad,xi,N,f,dx,eps,eps2,H);
    if (iVar1 == 0xf) {
      local_88 = 0xf;
    }
    if (0 < N) {
      memcpy(xi_00,xi,uVar5 * 8);
    }
  }
  if (local_88 == 0) {
    uVar8 = SUB84(dVar6,0);
    uVar9 = (undefined4)((ulong)dVar6 >> 0x20);
    if (dVar6 <= dVar11) {
      uVar8 = SUB84(dVar11,0);
      uVar9 = (undefined4)((ulong)dVar11 >> 0x20);
    }
    dVar7 = (double)CONCAT44(uVar9,uVar8) * 1000.0;
    do {
      iVar1 = (int)pdVar12;
      if (MAXITER <= *niter) {
        local_88 = 4;
        break;
      }
      *niter = *niter + 1;
      modelhess(H,N,dx,eps,L);
      scale(f,1,N,-1.0);
      linsolve_lower(L,N,f,x);
      scale(f,1,N,-1.0);
      if (method == 1) {
        iVar1 = trsrch_ddl(funcpt,xi_00,f,x,N,dx,dVar7,iVar1,L,H,stol,ioval,xf);
      }
      else {
        if (method != 0) {
          puts("The program accepts only two method values ");
          puts("Method 0 : Hook step ");
          puts("Method 1 : Double Dog Leg Step ");
          exit(1);
        }
        iVar1 = trsrch(funcpt,xi_00,f,x,N,dx,dVar7,*niter,L,H,stol,ioval,eps,xf);
      }
      dVar6 = (*funcpt->funcpt)(xf,N,funcpt->params);
      if (1.79769313486232e+308 <= ABS(dVar6)) {
        __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_00133906:
        printf(__format);
        local_88 = 0xf;
        break;
      }
      if (NAN(dVar6)) {
        __format = "Program Exiting as the function returns NaN";
        goto LAB_00133906;
      }
      iVar2 = grad_fd(funcpt,funcgrad,xf,N,dx,eps2,f);
      if (iVar2 == 0xf) {
        local_88 = 0xf;
        break;
      }
      local_88 = stopcheck(dVar6,N,xi_00,xf,f,dx,fsval,gtol,stol,iVar1);
      pdVar12 = H;
      iVar1 = hessian_opt(funcpt,funcgrad,xf,N,f,dx,eps,eps2,H);
      if (iVar1 == 0xf) {
        local_88 = 0xf;
      }
      if (0 < N) {
        memcpy(xi_00,xf,uVar5 * 8);
      }
    } while (local_88 == 0);
  }
  iVar1 = local_88;
  if (0 < N) {
    uVar3 = 0;
    do {
      xi[uVar3] = dx[uVar3] * xi[uVar3];
      dx[uVar3] = 1.0 / dx[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
LAB_001335e4:
  free(ioval);
  free(f);
  free(H);
  free(array);
  free(xi_00);
  free(L);
  free(x);
  return iVar1;
}

Assistant:

int newton_min_trust(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, double *dx, double fsval, double delta,
		int method,int MAXITER,int *niter,double eps,double gtol,double stol,double *xf) {
	int rcode,iter,gfdcode,hdcode;
	int i,siter,retval,fdiff;
	double dt1,dt2,eps2,eps3;
	double fx,num,den,stop0,maxstep,fxf;
	double *jac,*hess,*scheck,*xc,*L,*step;
	double *ioval;
	
	jac = (double*) malloc(sizeof(double) *N);
	scheck = (double*) malloc(sizeof(double) *N);
	xc = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	hess = (double*) malloc(sizeof(double) *N * N);
	L = (double*) malloc(sizeof(double) *N * N);
	ioval = (double*) malloc(sizeof(double) *8);
	
	/*
	 * Return Codes
	 * 
	 * Codes 1,2,3 denote possible success.
	 * Codes 0 and 4 denote failure.
	 * 
	 * 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	 * 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence not achieved.
	 * 
	 */ 
	
	rcode = 0;
	*niter = 0;
	siter = MAXITER;
	eps3 = pow(eps,(double) 1.0/3.0);
	eps2 = sqrt(eps);
	gfdcode = 0;
	hdcode = 0;
	//set values
	
	if (delta <= 0.0) {
		delta = -1.0;
	}
	ioval[0] = delta;
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	fx = FUNCPT_EVAL(funcpt, xi, N);
	if (fx >= DBL_MAX || fx <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fx != fx) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}
	
	gfdcode = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,jac);
	if (gfdcode == 15) {
		rcode = 15;
	}
	fdiff = 1;
	//grad_cd(funcpt,funcgrad,xi,N,dx,eps3,jac);
	
	maxstep = 1000.0; // Needs to be set at a much higher value proportional to l2 norm of dx
	dt1 = dt2 = 0.0;
	for(i = 0; i < N;++i) {
		dt1 += dx[i] * dx[i];
		dt2 += dx[i] * xi[i] * dx[i] * xi[i];
	}

	dt1 = sqrt(dt1);
	dt2 = sqrt(dt2);
	
	if (dt1 > dt2) {
		maxstep *= dt1;
	} else {
		maxstep *= dt2;
	}
	

	//Check Stop0
	if (fabs(fx) > fabs(fsval)) {
			den = fabs(fx);
	} else {
			den = fabs(fsval);
	}
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xi[i]);
		} else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}
	
	stop0 = array_max_abs(scheck,N);
	
	if (stop0 <= gtol * 1e-03) {
		rcode = 1;
		for(i = 0; i < N;++i) {
			xf[i] = xi[i];
		}
		
	}
	
	//hessian_fd(funcpt,xi,N,dx,eps,hess);
	hdcode = hessian_opt(funcpt,funcgrad,xi,N,jac,dx,eps,eps2,hess);
	if (hdcode == 15) {
		rcode = 15;
	}
	
	for(i = 0; i < N;++i) {
		xc[i] = xi[i];
	}
	
	while (rcode == 0 && *niter < siter) {
		*niter = *niter + 1;
		
		modelhess(hess,N,dx,eps,L);
		scale(jac,1,N,-1.0);
		
		linsolve_lower(L,N,jac,step);
		
		scale(jac,1,N,-1.0);
		iter = *niter;
		if (method == 0) {
			retval = trsrch(funcpt,xc,jac,step,N,dx,maxstep,iter,L,hess,stol,ioval,eps,xf);
		} else if (method == 1) {
			retval = trsrch_ddl(funcpt,xc,jac,step,N,dx,maxstep,iter,L,hess,stol,ioval,xf);
		}
		else {
			printf("The program accepts only two method values \n");
			printf("Method 0 : Hook step \n");
			printf("Method 1 : Double Dog Leg Step \n");
			exit(1);
		}
		
		fxf = FUNCPT_EVAL(funcpt, xf, N);
		if (fxf >= DBL_MAX || fxf <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			rcode = 15;
			break;
		}
		if (fxf != fxf) {
			printf("Program Exiting as the function returns NaN");
			rcode = 15;
			break;
		}

		gfdcode = grad_fd(funcpt,funcgrad,xf,N,dx,eps2,jac);
		if (gfdcode == 15) {
			rcode = 15;
			break;
		}
		//grad_cd(funcpt,funcgrad,xf,N,dx,eps3,jac);
		rcode = stopcheck(fxf,N,xc,xf,jac,dx,fsval,gtol,stol,retval);
		//hessian_fd(funcpt,xf,N,dx,eps,hess);
		hdcode = hessian_opt(funcpt,funcgrad,xf,N,jac,dx,eps,eps2,hess);
		if (hdcode == 15) {
			rcode = 15;
		}
		for(i = 0; i < N;++i) {
			xc[i] = xf[i];
		}
	}
	
	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}
	
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	
	free(ioval);
	free(jac);
	free(hess);
	free(scheck);
	free(xc);
	free(L);
	free(step);
	return rcode;
}